

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsbndmat.cpp
# Opt level: O0

TPZSBMatrix<std::complex<long_double>_> * __thiscall
TPZSBMatrix<std::complex<long_double>_>::operator-=
          (TPZSBMatrix<std::complex<long_double>_> *this,TPZSBMatrix<std::complex<long_double>_> *A)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  long *in_RSI;
  TPZSBMatrix<std::complex<long_double>_> *in_RDI;
  char *in_stack_00000178;
  char *in_stack_00000180;
  TPZSBMatrix<std::complex<long_double>_> *in_stack_ffffffffffffff78;
  TPZSBMatrix<std::complex<long_double>_> *this_00;
  TPZSBMatrix<std::complex<long_double>_> *in_stack_ffffffffffffffd0;
  TPZSBMatrix<std::complex<long_double>_> *in_stack_ffffffffffffffd8;
  
  iVar1 = (*(in_RDI->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable[0xc])();
  lVar2 = (**(code **)(*in_RSI + 0x60))();
  if ((CONCAT44(extraout_var,iVar1) != lVar2) || (in_RDI->fBand != in_RSI[8])) {
    TPZMatrix<std::complex<long_double>_>::Error(in_stack_00000180,in_stack_00000178);
  }
  this_00 = (TPZSBMatrix<std::complex<long_double>_> *)&stack0xffffffffffffffa8;
  operator-(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  operator=(this_00,in_stack_ffffffffffffff78);
  ~TPZSBMatrix((TPZSBMatrix<std::complex<long_double>_> *)0x13dc77f);
  return in_RDI;
}

Assistant:

TPZSBMatrix<TVar> &
TPZSBMatrix<TVar>::operator-=(const TPZSBMatrix<TVar> &A )
{
    if ( this->Dim() != A.Dim() || fBand != A.fBand)
       this->Error(__PRETTY_FUNCTION__,"operator+( TPZSBMatrix ) <incompatible dimensions>" );
    *this = *this-A;
    return *this;
}